

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

string * getRootDir_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string getRootDir()
{
    std::string ret;
#ifdef WIN32
    ret = getEnvironment("SystemDrive");
    if (ret.empty())
        ret = "c:";
    ret.append("/");
#else
    ret = "/";
#endif
    return ret;
}